

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeSIMDShuffle<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  uchar uVar1;
  bool bVar2;
  uchar *puVar3;
  reference pvVar4;
  allocator<char> local_81;
  string local_80;
  Err local_60;
  _Optional_payload_base<unsigned_char> local_3e;
  int local_3c;
  undefined1 local_38 [2];
  optional<unsigned_char> lane;
  int i;
  array<unsigned_char,_16UL> lanes;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  local_3c = 0;
  while( true ) {
    if (0xf < local_3c) {
      ParseDefsCtx::makeSIMDShuffle
                (__return_storage_ptr__,ctx,pos,annotations,(array<unsigned_char,_16UL> *)local_38);
      return __return_storage_ptr__;
    }
    local_3e = (_Optional_payload_base<unsigned_char>)Lexer::takeU8(&ctx->in);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&local_3e);
    if (!bVar2) break;
    puVar3 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)&local_3e);
    uVar1 = *puVar3;
    pvVar4 = std::array<unsigned_char,_16UL>::operator[]
                       ((array<unsigned_char,_16UL> *)local_38,(long)local_3c);
    *pvVar4 = uVar1;
    local_3c = local_3c + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"expected lane index",&local_81);
  Lexer::err(&local_60,&ctx->in,&local_80);
  Result<wasm::Ok>::Result(__return_storage_ptr__,&local_60);
  wasm::Err::~Err(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDShuffle(Ctx& ctx,
                         Index pos,
                         const std::vector<Annotation>& annotations) {
  std::array<uint8_t, 16> lanes;
  for (int i = 0; i < 16; ++i) {
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    lanes[i] = *lane;
  }
  return ctx.makeSIMDShuffle(pos, annotations, lanes);
}